

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O2

void __thiscall
SparseArray_Indices_Test<unsigned_int>::TestBody(SparseArray_Indices_Test<unsigned_int> *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *matcher;
  char *message;
  const_iterator cVar1;
  const_iterator cVar2;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<int> values;
  const_iterator __last;
  const_iterator __first;
  AssertHelper AStack_e8;
  unique_ptr<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
  arr;
  AssertionResult gtest_ar;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  undefined8 uStack_b0;
  indices idc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> actual;
  vector<unsigned_long,_std::allocator<unsigned_long>_> expected;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> indices;
  
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000005;
  uStack_b0 = 7;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_c8;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&indices,__l,(less<unsigned_long> *)&actual,(allocator_type *)&expected);
  values._M_len = 0;
  values._M_array = (iterator)&indices._M_t._M_impl.super__Rb_tree_header;
  pstore::sparse_array<int,unsigned_int>::make_unique<std::_Rb_tree_const_iterator<unsigned_long>>
            ((_Base_ptr)&arr,
             (_Rb_tree_const_iterator<unsigned_long>)
             indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left,values);
  idc.bitmap_ = *(uint *)arr._M_t.
                         super___uniq_ptr_impl<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pstore::sparse_array<int,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
                         .super__Head_base<0UL,_pstore::sparse_array<int,_unsigned_int>_*,_false>.
                         _M_head_impl;
  actual.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  actual.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  actual.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = pstore::sparse_array<int,_unsigned_int>::indices::begin(&idc);
  cVar2 = pstore::sparse_array<int,_unsigned_int>::indices::end(&idc);
  __first._4_4_ = 0;
  __first.bitmap_ = cVar1.bitmap_;
  __last._4_4_ = 0;
  __last.bitmap_ = cVar2.bitmap_;
  __last.pos_ = cVar2.pos_;
  __first.pos_ = cVar1.pos_;
  std::__copy_move<false,false,std::forward_iterator_tag>::
  __copy_m<pstore::sparse_array<int,unsigned_int>::indices::const_iterator,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (__first,__last,&actual);
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000005;
  uStack_b0 = 7;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&expected,__l_00,(allocator_type *)&gtest_ar);
  testing::ContainerEq<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)&local_68,(testing *)&expected,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
            ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)&local_c8,(internal *)&local_68,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  ::operator()(&gtest_ar,(char *)&local_c8,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)"actual");
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_c8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x11d,message);
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    if (local_c8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_c8._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&expected.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&actual.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  unique_ptr<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
  ::~unique_ptr(&arr);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&indices._M_t);
  return;
}

Assistant:

TYPED_TEST (SparseArray, Indices) {
    std::set<std::size_t> indices{2, 3, 5, 7};
    auto arr =
        sparse_array<int, TypeParam>::make_unique (std::begin (indices), std::end (indices), {});

    typename sparse_array<int, TypeParam>::indices idc{*arr};
    std::vector<std::size_t> actual;
    std::copy (std::begin (idc), std::end (idc), std::back_inserter (actual));
    std::vector<std::size_t> const expected{2, 3, 5, 7};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));
}